

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

void __thiscall
cs::compiler_type::process_char_buff
          (compiler_type *this,deque<char,_std::allocator<char>_> *raw_buff,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *tokens,charset encoding)

{
  iterator *piVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char32_t cVar3;
  undefined1 auVar4 [16];
  var vVar5;
  var vVar6;
  bool bVar7;
  _Alloc_hider _Var8;
  char cVar9;
  int iVar10;
  uint uVar11;
  long *plVar12;
  undefined *puVar13;
  undefined8 *puVar14;
  char32_t *pcVar15;
  undefined7 uVar24;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar16;
  _Elt_pointer pptVar17;
  const_iterator cVar18;
  proxy *ppVar19;
  signal_types *psVar20;
  const_iterator cVar21;
  _Any_data *p_Var22;
  compile_error *pcVar23;
  size_type sVar25;
  size_t sVar26;
  key_type *__k;
  anon_union_16_2_310e9938_for_data *__k_00;
  ulong uVar27;
  undefined8 uVar28;
  _Alloc_hider k;
  pointer __p;
  uint uVar29;
  iterator iVar30;
  u32string sig;
  u32string tmp;
  __string_type __str;
  u32string buff;
  anon_union_16_2_310e9938_for_data local_158;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  local_148;
  key_type local_130;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_110;
  undefined1 local_f0 [32];
  deque<cs::token_base*,std::allocator<cs::token_base*>> *local_d0;
  long *local_c8;
  undefined8 local_c0;
  ulong local_b8;
  any local_b0;
  compiler_type *local_a8;
  _func_int **local_a0;
  size_t local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  _func_int **pp_Stack_88;
  string local_80;
  var local_60;
  _func_int **local_58;
  proxy local_50;
  undefined **local_38;
  
  local_a8 = this;
  if ((raw_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
      _M_finish._M_cur ==
      (raw_buff->super__Deque_base<char,_std::allocator<char>_>)._M_impl.super__Deque_impl_data.
      _M_start._M_cur) {
    pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_80,"Received empty character buffer.","");
    compile_error::compile_error(pcVar23,&local_80);
    __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
  }
  if (encoding == gbk) {
    plVar12 = (long *)operator_new(8);
    puVar13 = &codecvt::gbk::vtable;
LAB_002aa0ab:
    *plVar12 = (long)(puVar13 + 0x10);
  }
  else if (encoding == utf8) {
    plVar12 = (long *)operator_new(0x68);
    *plVar12 = 0;
    plVar12[1] = 0;
    plVar12[10] = 0;
    plVar12[0xb] = 0;
    plVar12[8] = 0;
    plVar12[9] = 0;
    plVar12[6] = 0;
    plVar12[7] = 0;
    plVar12[4] = 0;
    plVar12[5] = 0;
    plVar12[2] = 0;
    plVar12[3] = 0;
    plVar12[0xc] = 0;
    *plVar12 = (long)&PTR__utf8_00336c30;
    puVar14 = (undefined8 *)operator_new(0x20);
    *(undefined4 *)(puVar14 + 1) = 0;
    puVar14[2] = 0x10ffff;
    *(undefined4 *)(puVar14 + 3) = 0;
    *puVar14 = &PTR____codecvt_utf8_base_00336c80;
    plVar12[1] = (long)puVar14;
    plVar12[2] = (long)(plVar12 + 4);
    plVar12[3] = 0;
    *(undefined1 *)(plVar12 + 4) = 0;
    plVar12[6] = (long)(plVar12 + 8);
    plVar12[7] = 0;
    *(undefined4 *)(plVar12 + 8) = 0;
    plVar12[10] = 0;
    plVar12[0xb] = 0;
    *(undefined2 *)(plVar12 + 0xc) = 0;
    local_80._M_dataplus._M_p = (pointer)0x0;
    std::unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_>::~unique_ptr
              ((unique_ptr<cs::codecvt::utf8,_std::default_delete<cs::codecvt::utf8>_> *)&local_80);
  }
  else {
    if (encoding == ascii) {
      plVar12 = (long *)operator_new(8);
      puVar13 = &codecvt::ascii::vtable;
      goto LAB_002aa0ab;
    }
    plVar12 = (long *)0x0;
  }
  local_c8 = plVar12;
  (**(code **)(*plVar12 + 0x10))(&local_80,plVar12,raw_buff);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_110.field_2._M_local_buf[0] = L'\0';
  local_d0 = (deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens;
  if (local_80._M_string_length == 0) {
    uVar11 = 0;
    local_c0 = (_Base_ptr)((ulong)local_c0._4_4_ << 0x20);
    uVar29 = 0;
  }
  else {
    uVar29 = 0;
    local_38 = &PTR__token_literal_00336a90;
    bVar7 = false;
    local_c0 = (_Base_ptr)((ulong)local_c0._4_4_ << 0x20);
    local_b8 = local_b8 & 0xffffffff00000000;
    k._M_p = local_80._M_dataplus._M_p;
    do {
      if ((local_b8 & 1) == 0) {
        if (((ulong)local_c0 & 1) != 0) {
          if (bVar7) {
            pcVar15 = mapping<char32_t,_char32_t>::match
                                ((mapping<char32_t,_char32_t> *)escape_map,(char32_t *)k._M_p);
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      (&local_110,*pcVar15);
            goto LAB_002aa1a1;
          }
          cVar3 = *(char32_t *)k._M_p;
          if (cVar3 == L'\\') goto LAB_002aa349;
          if (cVar3 == L'\"') {
            sVar26 = (size_t)(uint)*(char32_t *)((long)k._M_p + 4);
            cVar9 = (**(code **)(*plVar12 + 0x20))(plVar12);
            if (cVar9 == '\0') {
              (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
              cs_impl::any::any<std::__cxx11::string>
                        ((any *)local_f0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_158);
              local_130._M_dataplus._M_p = (pointer)new_value(local_a8,(any *)local_f0);
              pptVar17 = (tokens->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pptVar17 ==
                  (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                _M_push_back_aux<cs::token_base*>
                          ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                           (token_base **)&local_130);
              }
              else {
                *pptVar17 = (token_base *)local_130._M_dataplus._M_p;
                piVar1 = &(tokens->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
              cs_impl::any::recycle((any *)local_f0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                   *)local_158._int != &local_148) {
                operator_delete((void *)local_158._int,
                                CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
              }
            }
            else {
              paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                         *)token_base::operator_new((token_base *)0x50,sVar26);
              (**(code **)(*plVar12 + 0x18))(&local_60,plVar12,&local_110);
              local_a0 = (_func_int **)&local_90;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"");
              *(size_t *)((long)paVar16 + 8) = 1;
              paVar16->_M_allocated_capacity = (size_type)local_38;
              ((var_id *)(paVar16->_M_local_buf + 4))->m_domain_id =
                   (size_t)(paVar16->_M_local_buf + 8);
              if (local_60.mDat == &local_50) {
                (((shared_ptr<cs::domain_ref> *)(paVar16->_M_local_buf + 8))->
                super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                     (element_type *)CONCAT71(local_50._1_7_,local_50.is_rvalue);
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(paVar16->_M_local_buf + 10))->_M_pi
                     = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_50.refcount;
              }
              else {
                ((var_id *)(paVar16->_M_local_buf + 4))->m_domain_id = (size_t)local_60.mDat;
                (((shared_ptr<cs::domain_ref> *)(paVar16->_M_local_buf + 8))->
                super___shared_ptr<cs::domain_ref,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
                     (element_type *)CONCAT71(local_50._1_7_,local_50.is_rvalue);
              }
              (((token_value *)(paVar16->_M_local_buf + 6))->super_token_base)._vptr_token_base =
                   local_58;
              local_58 = (_func_int **)0x0;
              local_50.is_rvalue = false;
              (((token_value *)(paVar16->_M_local_buf + 0xc))->super_token_base)._vptr_token_base =
                   (_func_int **)(paVar16->_M_local_buf + 0x10);
              if (local_a0 == (_func_int **)&local_90) {
                vVar6.mDat._1_7_ = uStack_8f;
                vVar6.mDat._0_1_ = local_90;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar16->_M_local_buf + 0x10))->_M_allocated_capacity = (size_type)vVar6.mDat;
                (((token_value *)(paVar16->_M_local_buf + 0x12))->super_token_base)._vptr_token_base
                     = pp_Stack_88;
              }
              else {
                (((token_value *)(paVar16->_M_local_buf + 0xc))->super_token_base)._vptr_token_base
                     = local_a0;
                vVar5.mDat._1_7_ = uStack_8f;
                vVar5.mDat._0_1_ = local_90;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar16->_M_local_buf + 0x10))->_M_allocated_capacity = (size_type)vVar5.mDat;
              }
              *(size_t *)(paVar16->_M_local_buf + 0xe) = local_98;
              local_98 = 0;
              local_90 = 0;
              pptVar17 = (tokens->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
              local_158._int = (numeric_integer)paVar16;
              local_a0 = (_func_int **)&local_90;
              local_60.mDat = &local_50;
              if (pptVar17 ==
                  (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
                _M_push_back_aux<cs::token_base*>
                          ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                           (token_base **)&local_158._int);
              }
              else {
                *pptVar17 = (token_base *)paVar16;
                piVar1 = &(tokens->
                          super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                          _M_impl.super__Deque_impl_data._M_finish;
                piVar1->_M_cur = piVar1->_M_cur + 1;
              }
              if (local_a0 != (_func_int **)&local_90) {
                operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
              }
              if (local_60.mDat != &local_50) {
                operator_delete(local_60.mDat,CONCAT71(local_50._1_7_,local_50.is_rvalue) + 1);
              }
              uVar29 = 8;
            }
            local_110._M_string_length = 0;
            *local_110._M_dataplus._M_p = L'\0';
            local_c0 = (_Base_ptr)((ulong)local_c0._4_4_ << 0x20);
          }
          else {
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      (&local_110,cVar3);
          }
          goto LAB_002aaa1b;
        }
        cVar3 = *(char32_t *)k._M_p;
        if (cVar3 == L'#') break;
        if (uVar29 < 9) {
          switch(uVar29) {
          case 0:
            uVar24 = (undefined7)
                     ((ulong)((long)&switchD_002aa25b::switchdataD_002de2d0 +
                             (long)(int)(&switchD_002aa25b::switchdataD_002de2d0)[uVar29]) >> 8);
            if (cVar3 == L'\'') {
              k._M_p = k._M_p + 4;
              uVar29 = 0;
              local_b8 = CONCAT44(local_b8._4_4_,(int)CONCAT71(uVar24,1));
            }
            else if (cVar3 == L'\"') {
              k._M_p = k._M_p + 4;
              uVar29 = 0;
              local_c0 = (_Base_ptr)CONCAT44(local_c0._4_4_,(int)CONCAT71(uVar24,1));
            }
            else {
              iVar10 = iswspace(cVar3);
              if (iVar10 != 0) {
                k._M_p = k._M_p + 4;
                goto LAB_002aa61b;
              }
              auVar4 = ZEXT416((uint)*(char32_t *)k._M_p) * ZEXT816(0xde5fb9d2630458e9);
              local_158._int._0_4_ = *(char32_t *)k._M_p;
              iVar30 = phmap::priv::
                       raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                       ::find<char32_t>((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                                         *)&signals,(key_arg<char32_t> *)&local_158._int,
                                        auVar4._8_8_ + auVar4._0_8_);
              uVar29 = 3;
              if (iVar30.ctrl_ == (ctrl_t *)(signals + DAT_003473c8)) {
                iVar10 = iswdigit(*(char32_t *)k._M_p);
                uVar29 = 7;
                if (iVar10 == 0) {
                  cVar9 = (**(code **)(*plVar12 + 0x20))(plVar12,*(char32_t *)k._M_p);
                  uVar29 = 4;
                  if (cVar9 == '\0') {
                    pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
                    local_f0._16_4_ = *(undefined4 *)k._M_p;
                    local_f0._0_8_ = local_f0 + 0x10;
                    local_f0._8_8_ = 1;
                    local_f0._20_4_ = L'\0';
                    (**(code **)(*plVar12 + 0x18))(&local_130,plVar12);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&local_158,"Uknown character: ",&local_130);
                    compile_error::compile_error(pcVar23,(string *)&local_158);
                    __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
                  }
                }
              }
            }
            break;
          case 8:
            cVar9 = (**(code **)(*plVar12 + 0x20))(plVar12);
            if (cVar9 == '\0') {
              (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
              pptVar17 = (tokens->
                         super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                         _M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (pptVar17 ==
                  (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                  _M_impl.super__Deque_impl_data._M_finish._M_first) {
                pptVar17 = (tokens->
                           super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                           _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
              }
              std::__cxx11::string::operator=((string *)(pptVar17[-1] + 3),(string *)&local_158);
              if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
                   *)local_158._int != &local_148) {
                operator_delete((void *)local_158._int,
                                CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
              }
              local_110._M_string_length = 0;
              *local_110._M_dataplus._M_p = L'\0';
LAB_002aa61b:
              uVar29 = 0;
            }
            else {
              std::__cxx11::
              basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
              push_back(&local_110,*(char32_t *)k._M_p);
              k._M_p = k._M_p + 4;
              uVar29 = 8;
            }
          }
        }
      }
      else {
        if (bVar7) {
          pcVar15 = mapping<char32_t,_char32_t>::match
                              ((mapping<char32_t,_char32_t> *)escape_map,(char32_t *)k._M_p);
          std::__cxx11::
          basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                    (&local_110,*pcVar15);
LAB_002aa1a1:
          bVar7 = false;
        }
        else {
          cVar3 = *(char32_t *)k._M_p;
          if (cVar3 == L'\\') {
LAB_002aa349:
            bVar7 = true;
          }
          else if (cVar3 == L'\'') {
            if (local_110._M_string_length != 1) {
              if (local_110._M_string_length == 0) {
                pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
                local_158._int = (numeric_integer)&local_148;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_158,"Do not allow empty character.","");
                compile_error::compile_error(pcVar23,(string *)&local_158);
                __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
              }
              pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
              local_158._int = (numeric_integer)&local_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,"Char must be a single character.","");
              compile_error::compile_error(pcVar23,(string *)&local_158);
              __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
            }
            if (0x7f < (uint)*local_110._M_dataplus._M_p) {
              pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
              local_158._int = (numeric_integer)&local_148;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_158,
                         "Do not support unicode character. Please using string instead.","");
              compile_error::compile_error(pcVar23,(string *)&local_158);
              __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
            }
            local_f0[0] = (char)*local_110._M_dataplus._M_p;
            cs_impl::any::any<char>((any *)&local_130,local_f0);
            local_158._int = (numeric_integer)new_value(local_a8,(var *)&local_130);
            pptVar17 = (tokens->
                       super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                       _M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (pptVar17 ==
                (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
              _M_push_back_aux<cs::token_base*>
                        ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                         (token_base **)&local_158._int);
            }
            else {
              *pptVar17 = (token_base *)local_158._int;
              piVar1 = &(tokens->
                        super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                        _M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            cs_impl::any::recycle((any *)&local_130);
            local_110._M_string_length = 0;
            *local_110._M_dataplus._M_p = L'\0';
            local_b8 = local_b8 & 0xffffffff00000000;
          }
          else {
            std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::push_back
                      (&local_110,cVar3);
          }
        }
LAB_002aaa1b:
        k._M_p = k._M_p + 4;
      }
    } while (k._M_p != local_80._M_dataplus._M_p + local_80._M_string_length * 4);
    uVar11 = (uint)local_b8;
  }
  _Var8._M_p = local_110._M_dataplus._M_p;
  if ((uVar11 & 1) != 0) {
    pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
    local_158._int = (numeric_integer)&local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Lack of the \'.","");
    compile_error::compile_error(pcVar23,(string *)&local_158);
    __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
  }
  if (((ulong)local_c0 & 1) != 0) {
    pcVar23 = (compile_error *)__cxa_allocate_exception(0x28);
    local_158._int = (numeric_integer)&local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Lack of the \".","");
    compile_error::compile_error(pcVar23,(string *)&local_158);
    __cxa_throw(pcVar23,&compile_error::typeinfo,compile_error::~compile_error);
  }
  local_b8 = local_110._M_string_length;
  if (local_110._M_string_length == 0) goto switchD_002aacf7_caseD_5;
  switch(uVar29) {
  case 3:
    local_158._int = (numeric_integer)&local_148;
    local_158._8_8_ = 0;
    local_148._M_local_buf[0] = L'\0';
    paVar2 = &local_130.field_2;
    local_b8 = local_110._M_string_length << 2;
    sVar25 = 0;
    local_c0 = (_Base_ptr)(signal_map_abi_cxx11_ + 8);
    do {
      cVar3 = *(char32_t *)((long)_Var8._M_p + sVar25);
      local_f0._0_8_ = (proxy *)(local_f0 + 0x10);
      std::__cxx11::u32string::_M_construct<char32_t*>
                ((u32string *)local_f0,local_158._int,local_158._int + local_158._8_8_ * 4);
      std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
      _M_replace_aux((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                      *)local_f0,local_f0._8_8_,0,1,cVar3);
      __k = &local_130;
      (**(code **)(*local_c8 + 0x18))
                (__k,local_c8,
                 (basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *)
                 local_f0);
      cVar18 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>_>_>
                       *)signal_map_abi_cxx11_,__k);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar2) {
        __k = (key_type *)(local_130.field_2._M_allocated_capacity + 1);
        operator_delete(local_130._M_dataplus._M_p,(ulong)__k);
      }
      if ((proxy *)local_f0._0_8_ != (proxy *)(local_f0 + 0x10)) {
        __k = (key_type *)(CONCAT44(local_f0._20_4_,local_f0._16_4_) * 4 + 4);
        operator_delete((void *)local_f0._0_8_,(ulong)__k);
      }
      if (cVar18._M_node == local_c0) {
        ppVar19 = (proxy *)token_base::operator_new((token_base *)0x18,(size_t)__k);
        (**(code **)(*local_c8 + 0x18))(&local_130,local_c8,&local_158);
        psVar20 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                  ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                           *)signal_map_abi_cxx11_,&local_130);
        token_signal::token_signal((token_signal *)ppVar19,*psVar20);
        local_f0._0_8_ = ppVar19;
        if (*(undefined8 **)(local_d0 + 0x30) == (undefined8 *)(*(long *)(local_d0 + 0x40) + -8)) {
          std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
          _M_push_back_aux<cs::token_base*>(local_d0,(token_base **)local_f0);
        }
        else {
          **(undefined8 **)(local_d0 + 0x30) = ppVar19;
          *(long *)(local_d0 + 0x30) = *(long *)(local_d0 + 0x30) + 8;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_130._M_dataplus._M_p != paVar2) {
          operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
        }
        sVar26 = 0;
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::_M_replace_aux((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
                          *)&local_158,0,local_158._8_8_,1,*(char32_t *)((long)_Var8._M_p + sVar25))
        ;
      }
      else {
        sVar26 = (size_t)(uint)*(char32_t *)((long)_Var8._M_p + sVar25);
        std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
        ::push_back((basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *
                    )&local_158,*(char32_t *)((long)_Var8._M_p + sVar25));
      }
      plVar12 = local_c8;
      sVar25 = sVar25 + 4;
    } while (local_b8 != sVar25);
    if (local_158._8_8_ != 0) {
      ppVar19 = (proxy *)token_base::operator_new((token_base *)0x18,sVar26);
      (**(code **)(*plVar12 + 0x18))(&local_130,plVar12,&local_158);
      psVar20 = mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs::signal_types>
                         *)signal_map_abi_cxx11_,&local_130);
      token_signal::token_signal((token_signal *)ppVar19,*psVar20);
      local_f0._0_8_ = ppVar19;
      if (*(undefined8 **)(local_d0 + 0x30) == (undefined8 *)(*(long *)(local_d0 + 0x40) + -8)) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>(local_d0,(token_base **)local_f0);
      }
      else {
        **(undefined8 **)(local_d0 + 0x30) = ppVar19;
        *(long *)(local_d0 + 0x30) = *(long *)(local_d0 + 0x30) + 8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar2) {
        operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int == &local_148) goto switchD_002aacf7_caseD_5;
    uVar27 = CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) * 4 + 4;
    uVar28 = local_158._int;
    goto LAB_002ab208;
  case 4:
    (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
    __k_00 = &local_158;
    cVar21 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>_>_>
                     *)reserved_map_abi_cxx11_,(key_type *)__k_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int != &local_148) {
      __k_00 = (anon_union_16_2_310e9938_for_data *)
               (CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
      operator_delete((void *)local_158._int,(ulong)__k_00);
    }
    if (cVar21._M_node != (_Base_ptr)(reserved_map_abi_cxx11_ + 8)) {
      (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
      p_Var22 = (_Any_data *)
                mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                ::match((mapping<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<cs::token_base_*()>_>
                         *)reserved_map_abi_cxx11_,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &local_158);
      if (*(long *)(p_Var22 + 1) == 0) {
        std::__throw_bad_function_call();
      }
      local_130._M_dataplus._M_p = (pointer)(**(code **)(p_Var22->_M_pod_data + 0x18))(p_Var22);
      if (*(undefined8 **)(local_d0 + 0x30) == (undefined8 *)(*(long *)(local_d0 + 0x40) + -8)) {
        std::deque<cs::token_base*,std::allocator<cs::token_base*>>::
        _M_push_back_aux<cs::token_base*>(local_d0,(token_base **)&local_130);
      }
      else {
        **(undefined8 **)(local_d0 + 0x30) = local_130._M_dataplus._M_p;
        *(long *)(local_d0 + 0x30) = *(long *)(local_d0 + 0x30) + 8;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
           *)local_158._int != &local_148) {
        operator_delete((void *)local_158._int,
                        CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]) + 1);
      }
      local_110._M_string_length = 0;
      *local_110._M_dataplus._M_p = L'\0';
      goto switchD_002aacf7_caseD_5;
    }
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
               *)token_base::operator_new((token_base *)0x50,(size_t)__k_00);
    (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
    token_id::token_id((token_id *)paVar16,(string *)&local_158);
    local_130._M_dataplus._M_p = (pointer)paVar16;
    if (*(undefined8 **)(local_d0 + 0x30) == (undefined8 *)(*(long *)(local_d0 + 0x40) + -8)) {
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
                (local_d0,(token_base **)&local_130);
    }
    else {
      **(undefined8 **)(local_d0 + 0x30) = paVar16;
      *(long *)(local_d0 + 0x30) = *(long *)(local_d0 + 0x30) + 8;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int == &local_148) goto switchD_002aacf7_caseD_5;
    break;
  default:
    goto switchD_002aacf7_caseD_5;
  case 7:
    (**(code **)(*plVar12 + 0x18))(&local_130,plVar12,&local_110);
    parse_number((numeric *)&local_158,&local_130);
    cs_impl::any::any<cs::numeric>(&local_b0,(numeric *)&local_158);
    local_f0._0_8_ = new_value(local_a8,&local_b0);
    pptVar17 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar17 ==
        (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<cs::token_base*,std::allocator<cs::token_base*>>::_M_push_back_aux<cs::token_base*>
                ((deque<cs::token_base*,std::allocator<cs::token_base*>> *)tokens,
                 (token_base **)local_f0);
    }
    else {
      *pptVar17 = (token_base *)local_f0._0_8_;
      piVar1 = &(tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                _M_impl.super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    cs_impl::any::recycle(&local_b0);
    uVar28 = local_130._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p == &local_130.field_2) goto switchD_002aacf7_caseD_5;
    goto LAB_002ab205;
  case 8:
    (**(code **)(*plVar12 + 0x18))(&local_158,plVar12,&local_110);
    pptVar17 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
               _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pptVar17 ==
        (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
        super__Deque_impl_data._M_finish._M_first) {
      pptVar17 = (tokens->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    std::__cxx11::string::operator=((string *)(pptVar17[-1] + 3),(string *)&local_158);
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)local_158._int == &local_148) goto switchD_002aacf7_caseD_5;
  }
  local_130.field_2._M_allocated_capacity =
       CONCAT44(local_148._M_local_buf[1],local_148._M_local_buf[0]);
  uVar28 = local_158._int;
LAB_002ab205:
  uVar27 = local_130.field_2._M_allocated_capacity + 1;
LAB_002ab208:
  operator_delete((void *)uVar28,uVar27);
switchD_002aacf7_caseD_5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,
                    CONCAT44(local_110.field_2._M_local_buf[1],local_110.field_2._M_local_buf[0]) *
                    4 + 4);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity * 4 + 4);
  }
  if (plVar12 != (long *)0x0) {
    (**(code **)(*plVar12 + 8))(plVar12);
  }
  return;
}

Assistant:

void compiler_type::process_char_buff(const std::deque<char> &raw_buff, std::deque<token_base *> &tokens,
	                                      charset encoding)
	{
		if (raw_buff.empty())
			throw compile_error("Received empty character buffer.");
		std::unique_ptr<codecvt::charset> cvt = nullptr;
		switch (encoding) {
		case charset::ascii:
			cvt = std::make_unique<codecvt::ascii>();
			break;
		case charset::utf8:
			cvt = std::make_unique<codecvt::utf8>();
			break;
		case charset::gbk:
			cvt = std::make_unique<codecvt::gbk>();
			break;
		}
		std::u32string buff = cvt->local2wide(raw_buff);
		std::u32string tmp;
		token_types type = token_types::null;
		bool inside_char = false;
		bool inside_str = false;
		bool escape = false;
		for (auto it = buff.begin(); it != buff.end();) {
			if (inside_char) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\'') {
					if (tmp.empty())
						throw compile_error("Do not allow empty character.");
					if (tmp.size() > 1)
						throw compile_error("Char must be a single character.");
					if (tmp[0] > CHAR_MAX)
						throw compile_error("Do not support unicode character. Please using string instead.");
					tokens.push_back(new_value((char) tmp[0]));
					tmp.clear();
					inside_char = false;
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (inside_str) {
				if (escape) {
					tmp += escape_map.match(*it);
					escape = false;
				}
				else if (*it == '\\') {
					escape = true;
				}
				else if (*it == '\"') {
					inside_str = false;
					if (cvt->is_identifier(*(it + 1))) {
						tokens.push_back(new token_literal(cvt->wide2local(tmp), ""));
						type = token_types::literal;
					}
					else
						tokens.push_back(new_value(cvt->wide2local(tmp)));
					tmp.clear();
				}
				else {
					tmp += *it;
				}
				++it;
				continue;
			}
			if (*it == '#')
				break;
			switch (type) {
			default:
				break;
			case token_types::null:
				if (*it == '\"') {
					inside_str = true;
					++it;
					continue;
				}
				if (*it == '\'') {
					inside_char = true;
					++it;
					continue;
				}
				if (std::iswspace(*it)) {
					++it;
					continue;
				}
				if (issignal(*it)) {
					type = token_types::signal;
					continue;
				}
				if (std::iswdigit(*it)) {
					type = token_types::value;
					continue;
				}
				if (cvt->is_identifier(*it)) {
					type = token_types::id;
					continue;
				}
				throw compile_error(std::string("Uknown character: " + cvt->wide2local(std::u32string(1, *it))));
				break;
			case token_types::id:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				if (reserved_map.exist(cvt->wide2local(tmp))) {
					tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
					tmp.clear();
					break;
				}
				tokens.push_back(new token_id(cvt->wide2local(tmp)));
				tmp.clear();
				break;
			case token_types::literal:
				if (cvt->is_identifier(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
				tmp.clear();
				break;
			case token_types::signal: {
				if (issignal(*it)) {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				std::u32string sig;
				for (auto &ch: tmp) {
					if (!signal_map.exist(cvt->wide2local(sig + ch))) {
						tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
						sig = ch;
					}
					else
						sig += ch;
				}
				if (!sig.empty())
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
				tmp.clear();
				break;
			}
			case token_types::value:
				if (std::iswdigit(*it) || *it == '.') {
					tmp += *it;
					++it;
					continue;
				}
				type = token_types::null;
				tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
				tmp.clear();
				break;
			}
		}
		if (inside_char)
			throw compile_error("Lack of the \'.");
		if (inside_str)
			throw compile_error("Lack of the \".");
		if (tmp.empty())
			return;
		switch (type) {
		default:
			break;
		case token_types::id:
			if (reserved_map.exist(cvt->wide2local(tmp))) {
				tokens.push_back(reserved_map.match(cvt->wide2local(tmp))());
				tmp.clear();
				break;
			}
			tokens.push_back(new token_id(cvt->wide2local(tmp)));
			break;
		case token_types::literal:
			static_cast<token_literal *>(tokens.back())->m_literal = cvt->wide2local(tmp);
			break;
		case token_types::signal: {
			std::u32string sig;
			for (auto &ch: tmp) {
				if (!signal_map.exist(cvt->wide2local(sig + ch))) {
					tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
					sig = ch;
				}
				else
					sig += ch;
			}
			if (!sig.empty())
				tokens.push_back(new token_signal(signal_map.match(cvt->wide2local(sig))));
			break;
		}
		case token_types::value:
			tokens.push_back(new_value(parse_number(cvt->wide2local(tmp))));
			break;
		}
	}